

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsPopupOpen(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  ImGuiID id;
  
  id = 0;
  if (-1 < (char)popup_flags) {
    id = ImGuiWindow::GetID(GImGui->CurrentWindow,str_id,(char *)0x0);
  }
  if ((((uint)popup_flags >> 8 & 1) != 0) && (id != 0)) {
    __assert_fail("0 && \"Cannot use IsPopupOpen() with a string id and ImGuiPopupFlags_AnyPopupLevel.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,7999,"bool ImGui::IsPopupOpen(const char *, ImGuiPopupFlags)");
  }
  bVar1 = IsPopupOpen(id,popup_flags);
  return bVar1;
}

Assistant:

bool ImGui::IsPopupOpen(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = (popup_flags & ImGuiPopupFlags_AnyPopupId) ? 0 : g.CurrentWindow->GetID(str_id);
    if ((popup_flags & ImGuiPopupFlags_AnyPopupLevel) && id != 0)
        IM_ASSERT(0 && "Cannot use IsPopupOpen() with a string id and ImGuiPopupFlags_AnyPopupLevel."); // But non-string version is legal and used internally
    return IsPopupOpen(id, popup_flags);
}